

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::BbrDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::BbrDataset&,unsigned_short>>
               (tuple<testing::Matcher<ot::commissioner::BbrDataset_&>,_testing::Matcher<unsigned_short>_>
                *matcher_tuple,tuple<ot::commissioner::BbrDataset_&,_unsigned_short> *value_tuple)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  
  peVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::BbrDataset_&>,_testing::Matcher<unsigned_short>_>
           ).super__Head_base<0UL,_testing::Matcher<ot::commissioner::BbrDataset_&>,_false>.
           _M_head_impl.super_MatcherBase<ot::commissioner::BbrDataset_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::BbrDataset_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  cVar3 = (**(code **)(*(long *)peVar1 + 0x20))
                    (peVar1,(value_tuple->
                            super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>).
                            super__Head_base<0UL,_ot::commissioner::BbrDataset_&,_false>.
                            _M_head_impl);
  if (cVar3 == '\0') {
    uVar4 = 0;
  }
  else {
    peVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::BbrDataset_&>,_testing::Matcher<unsigned_short>_>
             ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_short>_>.
             super__Head_base<1UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
             super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar5 = (*(peVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar2,value_tuple);
    uVar4 = (undefined1)iVar5;
  }
  return (bool)uVar4;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }